

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void duckdb_je_dallocx(void *ptr,int flags)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  uint8_t uVar3;
  rtree_leaf_elm_t *prVar4;
  void *pvVar5;
  uint64_t uVar6;
  size_t __n;
  rtree_leaf_elm_t *prVar7;
  ushort uVar8;
  tcaches_t *ptVar9;
  tsd_t *tsd;
  rtree_leaf_elm_t *prVar10;
  ulong uVar11;
  void **ppvVar12;
  tcaches_t tVar13;
  uintptr_t in_RCX;
  cache_bin_t *bin_1;
  cache_bin_t *pcVar14;
  ulong uVar15;
  rtree_ctx_cache_elm_t *prVar16;
  rtree_ctx_cache_elm_t *prVar17;
  uintptr_t in_R8;
  undefined7 uVar18;
  cache_bin_t *bin;
  rtree_ctx_t *ctx;
  rtree_t *prVar19;
  szind_t binind;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  rtree_metadata_t rVar20;
  uintptr_t args_raw [3];
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1e0;
  void *local_1c8;
  long local_1c0;
  undefined8 local_1b8;
  _Bool local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
  }
  ptVar9 = duckdb_je_tcaches;
  uVar15 = 0xfffffffe;
  if ((flags & 0xfff00U) != 0) {
    if ((flags & 0xfff00U) == 0x100) {
      uVar15 = 0xffffffff;
    }
    else {
      uVar15 = (ulong)(((flags & 0xfff00U) >> 8) - 2);
    }
  }
  uVar3 = (tsd->state).repr;
  if ((int)uVar15 == -1) {
LAB_01c61ef9:
    tcache.tcache = (tcache_t *)0x0;
  }
  else if ((int)uVar15 == -2) {
    if (uVar3 == '\0') {
      tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
    else {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level != '\0')
      goto LAB_01c61ef9;
      tcache.tcache = (tcache_t *)0x0;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
        tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      }
    }
  }
  else {
    if (duckdb_je_tcaches[uVar15].field_0.tcache == (tcache_t *)0x0) {
      duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
      abort();
    }
    if (duckdb_je_tcaches[uVar15].field_0.tcache == (tcache_t *)&DAT_00000001) {
      tVar13.field_0 =
           (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcache_create_explicit(tsd);
      ptVar9[uVar15].field_0 = tVar13.field_0;
    }
    tcache.tcache = ptVar9[uVar15].field_0.tcache;
  }
  if (uVar3 != '\0') {
    local_1c0 = (long)flags;
    local_1b8 = 0;
    local_1c8 = ptr;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_dallocx,ptr,(uintptr_t *)&local_1c8);
    if (tsd == (tsd_t *)0x0) {
      prVar19 = (rtree_t *)&stack0xfffffffffffffe50;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar19);
    }
    else {
      prVar19 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rVar20 = rtree_metadata_read((tsdn_t *)tsd,prVar19,(rtree_ctx_t *)ptr,in_RCX);
    uVar15 = rVar20._0_8_;
    binind = rVar20.szind;
    __n = duckdb_je_sz_index2size_tab[uVar15 & 0xffffffff];
    if (duckdb_je_opt_junk_free == true) {
      switchD_0105dc25::default(ptr,0x5a,__n);
    }
    if (tcache.tcache == (tcache_t *)0x0) {
      arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
    }
    else if ((rVar20._8_4_ >> 8 & 1) == 0) {
      if (binind < (tcache.tcache)->tcache_slow->tcache_nbins) {
        uVar15 = uVar15 & 0xffffffff;
        ppvVar12 = (tcache.tcache)->bins[uVar15].stack_head;
        if (ppvVar12 != (void **)&duckdb_je_disabled_bin) {
          pcVar14 = (tcache.tcache)->bins + uVar15;
          if ((tcache.tcache)->bins[uVar15].low_bits_full == (uint16_t)ppvVar12) {
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,pcVar14,binind,
                       (uint)((tcache.tcache)->bins[uVar15].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01c623b9;
          }
          goto LAB_01c6209e;
        }
      }
      if (tsd == (tsd_t *)0x0) {
        prVar19 = (rtree_t *)&stack0xfffffffffffffe50;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar19);
      }
      else {
        prVar19 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1e0,(tsdn_t *)tsd,prVar19,(rtree_ctx_t *)ptr,in_R8);
      duckdb_je_large_dalloc((tsdn_t *)tsd,local_1e0.edata);
    }
    else {
      uVar15 = uVar15 & 0xffffffff;
      pcVar14 = (tcache.tcache)->bins + uVar15;
      ppvVar12 = pcVar14->stack_head;
      if ((tcache.tcache)->bins[uVar15].low_bits_full == (uint16_t)ppvVar12) {
        if (pcVar14->stack_head == (void **)&duckdb_je_disabled_bin) {
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        }
        else {
          duckdb_je_tcache_bin_flush_small
                    (tsd,tcache.tcache,pcVar14,binind,
                     (uint)((tcache.tcache)->bins[uVar15].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c623b9:
          ppvVar12 = pcVar14->stack_head;
          if (pcVar14->low_bits_full != (uint16_t)ppvVar12) goto LAB_01c6209e;
        }
      }
      else {
LAB_01c6209e:
        pcVar14->stack_head = ppvVar12 + -1;
        ppvVar12[-1] = ptr;
      }
    }
    uVar6 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar6 + __n;
    if (__n < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar6) {
      return;
    }
    goto LAB_01c620fb;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = (rtree_ctx_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar10 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar15 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar15);
  prVar4 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar15);
  if (prVar4 == prVar10) {
    prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)ctx->l2_cache[0].leafkey == prVar10) {
    prVar7 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)prVar4;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar10;
    puVar2[1] = (ulong)prVar7;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar7->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar16 = ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)ctx->l2_cache[1].leafkey == prVar10) {
      uVar11 = 0;
      in_R8 = 0;
    }
    else {
      uVar15 = 1;
      prVar17 = prVar16;
      do {
        uVar11 = uVar15;
        uVar18 = (undefined7)(in_R8 >> 8);
        if (uVar11 == 7) {
          in_R8 = CONCAT71(uVar18,6 < uVar11);
          goto LAB_01c6235a;
        }
        prVar16 = prVar17 + 1;
        prVar1 = prVar17 + 1;
        uVar15 = uVar11 + 1;
        prVar17 = prVar16;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar10);
      in_R8 = CONCAT71(uVar18,6 < uVar11);
    }
    prVar7 = prVar16->leaf;
    prVar16->leafkey = ctx->l2_cache[uVar11].leafkey;
    prVar16->leaf = ctx->l2_cache[uVar11].leaf;
    ctx->l2_cache[uVar11].leafkey = (uintptr_t)prVar4;
    ctx->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar10;
    puVar2[1] = (ulong)prVar7;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar7->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01c6235a:
    if ((char)in_R8 != '\0') {
      in_R8 = 1;
      prVar10 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,
                           false);
    }
  }
  pvVar5 = (prVar10->le_bits).repr;
  uVar11 = (ulong)pvVar5 >> 0x30;
  uVar15 = duckdb_je_sz_index2size_tab[uVar11];
  if (tcache.tcache == (tcache_t *)0x0) {
    arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
  }
  else {
    uVar8 = (ushort)((ulong)pvVar5 >> 0x30);
    if (((ulong)pvVar5 & 1) == 0) {
      if (((uint)uVar8 < (tcache.tcache)->tcache_slow->tcache_nbins) &&
         (ppvVar12 = (tcache.tcache)->bins[uVar11].stack_head,
         ppvVar12 != (void **)&duckdb_je_disabled_bin)) {
        pcVar14 = (tcache.tcache)->bins + uVar11;
        if ((tcache.tcache)->bins[uVar11].low_bits_full == (uint16_t)ppvVar12) {
          duckdb_je_tcache_bin_flush_large
                    (tsd,tcache.tcache,pcVar14,(uint)uVar8,
                     (uint)((tcache.tcache)->bins[uVar11].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          goto LAB_01c62200;
        }
        goto LAB_01c61f8e;
      }
      if (tsd == (tsd_t *)0x0) {
        prVar19 = (rtree_t *)&stack0xfffffffffffffe50;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar19);
      }
      else {
        prVar19 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1e0,(tsdn_t *)tsd,prVar19,(rtree_ctx_t *)ptr,in_R8);
      duckdb_je_large_dalloc((tsdn_t *)tsd,local_1e0.edata);
    }
    else {
      pcVar14 = (tcache.tcache)->bins + uVar11;
      ppvVar12 = pcVar14->stack_head;
      if ((tcache.tcache)->bins[uVar11].low_bits_full == (uint16_t)ppvVar12) {
        if (pcVar14->stack_head == (void **)&duckdb_je_disabled_bin) {
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        }
        else {
          duckdb_je_tcache_bin_flush_small
                    (tsd,tcache.tcache,pcVar14,(uint)uVar8,
                     (uint)((tcache.tcache)->bins[uVar11].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c62200:
          ppvVar12 = pcVar14->stack_head;
          if (pcVar14->low_bits_full != (uint16_t)ppvVar12) {
            pcVar14->stack_head = ppvVar12 + -1;
            ppvVar12[-1] = ptr;
          }
        }
      }
      else {
LAB_01c61f8e:
        pcVar14->stack_head = ppvVar12 + -1;
        ppvVar12[-1] = ptr;
      }
    }
  }
  uVar6 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar6 + uVar15;
  if (uVar15 < tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
               uVar6) {
    return;
  }
LAB_01c620fb:
  local_190 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
  ;
  local_198 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_1a0 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_1a8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_1b0 = false;
  duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&stack0xfffffffffffffe50);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_dallocx(void *ptr, int flags) {
	LOG("core.dallocx.entry", "ptr: %p, flags: %d", ptr, flags);

	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		ifree(tsd, ptr, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, flags};
		hook_invoke_dalloc(hook_dalloc_dallocx, ptr, args_raw);
		ifree(tsd, ptr, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.dallocx.exit", "");
}